

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

void __thiscall duckdb::LocalSortState::SortInMemory(LocalSortState *this)

{
  BufferManager *buffer_manager;
  _Tuple_impl<0UL,_duckdb::AllocatorDebugInfo_*,_std::default_delete<duckdb::AllocatorDebugInfo>_>
  _Var1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_00;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_duckdb[P]duckdb_src_common_sort_radix_sort_cpp:32:12)>
  __comp_02;
  bool bVar2;
  _Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false> _Var3;
  const_reference cVar4;
  int iVar5;
  pointer __p;
  reference this_00;
  reference pvVar6;
  type pRVar7;
  uint *puVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  pointer __p_00;
  pointer pSVar11;
  const_reference pvVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  undefined4 extraout_var;
  uint32_t i;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  data_ptr_t pdVar19;
  idx_t iVar20;
  allocate_function_ptr_t l_ptr;
  SortLayout *pSVar21;
  _Head_base<0UL,_bool_*,_false> ties;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  allocate_function_ptr_t r_ptr;
  idx_t *piVar25;
  idx_t i_1;
  ulong uVar26;
  uchar **ppuVar27;
  bool bVar28;
  idx_t sorting_size;
  unsafe_unique_array<bool> ties_ptr;
  idx_t col_offset;
  data_ptr_t dataptr;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> ptr_block;
  idx_t row_width;
  int order;
  value_type logical_type;
  data_ptr_t blob_row_ptr;
  BufferHandle handle;
  size_type local_180;
  _Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false> local_178;
  idx_t *local_170;
  ulong local_168;
  uchar **local_160;
  idx_t local_158;
  bool *local_150;
  __uniq_ptr_impl<bool,_std::default_delete<bool[]>_> local_148;
  idx_t local_140;
  data_ptr_t local_138;
  AllocatedData local_130;
  const_reference pvStack_118;
  idx_t *local_110;
  LogicalType *pLStack_108;
  data_ptr_t local_100;
  const_reference local_f8;
  _Head_base<0UL,_unsigned_char_**,_false> local_f0;
  idx_t local_e8;
  Allocator local_e0;
  BufferManager *local_c0;
  size_t local_b8;
  ulong local_b0;
  RowLayout *local_a8;
  vector<unsigned_long,_true> *local_a0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_98;
  vector<duckdb::OrderType,_true> *local_90;
  allocate_function_ptr_t local_88;
  LogicalType local_80;
  allocate_function_ptr_t local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::back(&this->sorted_blocks);
  local_e0.reallocate_function =
       (reallocate_function_ptr_t)
       unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::operator*
                 (this_00);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                   *)local_e0.reallocate_function);
  pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator*(pvVar6);
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_48,this->buffer_manager,pRVar7);
  local_138 = BufferHandle::Ptr(&local_48);
  local_170 = &pRVar7->count;
  pSVar21 = this->sort_layout;
  puVar8 = (uint *)(local_138 + pSVar21->comparison_size);
  for (uVar15 = 0; (ulong)uVar15 < *local_170; uVar15 = uVar15 + 1) {
    *puVar8 = uVar15;
    pSVar21 = this->sort_layout;
    puVar8 = (uint *)((long)puVar8 + pSVar21->entry_size);
  }
  local_158 = 0;
  local_140 = 0;
  local_148._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl =
       (tuple<bool_*,_std::default_delete<bool[]>_>)
       (_Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>)0x0;
  local_e0.reallocate_function =
       (reallocate_function_ptr_t)((long)local_e0.reallocate_function + 0x18);
  ties._M_head_impl = (bool *)0x0;
  bVar28 = false;
  local_e0.private_data.
  super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
  .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
       )(unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
         )this;
  for (local_180 = 0; local_180 < pSVar21->column_count; local_180 = local_180 + 1) {
    pvVar9 = vector<unsigned_long,_true>::get<true>(&pSVar21->column_sizes,local_180);
    local_158 = local_158 + *pvVar9;
    bVar2 = !bVar28;
    bVar28 = true;
    if (bVar2) {
      pvVar10 = vector<duckdb::LogicalType,_true>::get<true>
                          (&this->sort_layout->logical_types,local_180);
      bVar28 = pvVar10->physical_type_ == VARCHAR;
    }
    cVar4 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,local_180);
    pdVar19 = local_138;
    if ((!cVar4) || (pSVar21 = this->sort_layout, pSVar21->column_count - 1 <= local_180)) {
      buffer_manager = this->buffer_manager;
      if (ties._M_head_impl == (bool *)0x0) {
        RadixSort(buffer_manager,&local_138,local_170,&local_140,&local_158,this->sort_layout,bVar28
                 );
        piVar25 = local_170;
        __p_00 = (pointer)operator_new__(*local_170);
        local_130.allocator.ptr = (Allocator *)0x0;
        ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset(&local_148,__p_00);
        ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
                  ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_130);
        ties._M_head_impl =
             (bool *)local_148._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                     super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        local_130.allocator.ptr._0_1_ = 1;
        ::std::__fill_n_a<bool*,unsigned_long,bool>
                  (local_148._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl,*piVar25 - 1,&local_130);
        (ties._M_head_impl + -1)[*piVar25] = false;
      }
      else {
        pSVar21 = this->sort_layout;
        for (uVar23 = 0; uVar14 = *local_170, this = (LocalSortState *)local_e0.private_data,
            uVar23 < uVar14; uVar23 = uVar23 + 1) {
          if (ties._M_head_impl[uVar23] == true) {
            uVar17 = uVar23;
            do {
              uVar26 = uVar17 + 1;
              uVar16 = uVar14 - 1;
              uVar22 = uVar14;
              if (uVar14 <= uVar26) break;
              lVar18 = uVar17 + 1;
              uVar16 = uVar17;
              uVar17 = uVar26;
              uVar22 = uVar26;
            } while (ties._M_head_impl[lVar18] != false);
            local_130.allocator.ptr = (Allocator *)(pdVar19 + uVar23 * pSVar21->entry_size);
            local_80._0_8_ = (uVar16 - uVar23) + 2;
            RadixSort(buffer_manager,(data_ptr_t *)&local_130,(idx_t *)&local_80,&local_140,
                      &local_158,pSVar21,bVar28);
            uVar23 = uVar22;
          }
        }
      }
      cVar4 = vector<bool,_true>::get<true>
                        ((vector<bool,_true> *)
                         ((long)(((PrivateAllocatorData *)this)->debug_info).
                                super_unique_ptr<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::AllocatorDebugInfo_*,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                .super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false> + 0x58),
                         local_180);
      piVar25 = local_170;
      _Var1.super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>._M_head_impl =
           (((PrivateAllocatorData *)this)->debug_info).
           super_unique_ptr<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::AllocatorDebugInfo_*,_std::default_delete<duckdb::AllocatorDebugInfo>_>
           .super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>;
      if ((cVar4) &&
         (local_180 ==
          *(long *)_Var1.super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>._M_head_impl -
          1U)) break;
      pdVar19 = local_138 + local_140;
      local_150 = ties._M_head_impl;
      for (uVar23 = 0; ties._M_head_impl = local_150, uVar23 < *piVar25 - 1; uVar23 = uVar23 + 1) {
        iVar20 = *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>.
                                  _M_head_impl + 0xf8);
        if (local_150[uVar23] == true) {
          iVar5 = FastMemcmp(pdVar19,pdVar19 + iVar20,local_158);
          bVar28 = iVar5 == 0;
          iVar20 = *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>
                                    ._M_head_impl + 0xf8);
        }
        else {
          bVar28 = false;
        }
        local_150[uVar23] = bVar28;
        pdVar19 = pdVar19 + iVar20;
      }
      bVar28 = AnyTies(local_150,piVar25);
      if (!bVar28) break;
      cVar4 = vector<bool,_true>::get<true>
                        ((vector<bool,_true> *)
                         ((long)(((PrivateAllocatorData *)this)->debug_info).
                                super_unique_ptr<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::AllocatorDebugInfo_*,_std::default_delete<duckdb::AllocatorDebugInfo>_>
                                .super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false> + 0x58),
                         local_180);
      if (!cVar4) {
        local_c0 = *(BufferManager **)&((PrivateAllocatorData *)this)->free_type;
        local_178._M_head_impl =
             (((PrivateAllocatorData *)this)->debug_info).
             super_unique_ptr<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::AllocatorDebugInfo,_std::default_delete<duckdb::AllocatorDebugInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AllocatorDebugInfo_*,_std::default_delete<duckdb::AllocatorDebugInfo>_>
             .super__Head_base<0UL,_duckdb::AllocatorDebugInfo_*,_false>._M_head_impl;
        local_100 = local_138;
        pSVar11 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                              *)local_e0.reallocate_function);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::back(&pSVar11->data_blocks);
        pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                 operator*(pvVar6);
        (*local_c0->_vptr_BufferManager[7])(&local_60,local_c0,pRVar7);
        local_88 = (allocate_function_ptr_t)BufferHandle::Ptr(&local_60);
        local_a8 = (RowLayout *)((long)local_178._M_head_impl + 0x100);
        local_90 = (vector<duckdb::OrderType,_true> *)((long)local_178._M_head_impl + 8);
        local_98 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)((long)local_178._M_head_impl + 0x158);
        local_a0 = &((RowLayout *)((long)local_178._M_head_impl + 0x100))->offsets;
        uVar23 = 0;
        piVar25 = local_170;
        while (local_168 = *piVar25, uVar23 < local_168) {
          uVar14 = uVar23;
          if (ties._M_head_impl[uVar23] == true) {
            uVar17 = uVar23;
            do {
              uVar16 = uVar14;
              uVar17 = uVar17 + 1;
              uVar14 = uVar16 + 1;
              uVar26 = local_168 - 1;
              local_b0 = local_168;
              if (local_168 <= uVar14) break;
              uVar26 = uVar16;
              local_b0 = uVar14;
            } while (ties._M_head_impl[uVar16 + 1] != false);
            local_e0.allocate_function = local_88;
            local_e8 = ((RowLayout *)((long)local_178._M_head_impl + 0x100))->row_width;
            pdVar19 = local_100 + *(idx_t *)((long)local_178._M_head_impl + 0xf8) * uVar23;
            local_68 = local_88 +
                       *(uint *)(pdVar19 + *(idx_t *)((long)local_178._M_head_impl + 0xf0)) *
                       local_e8;
            bVar28 = Comparators::TieIsBreakable
                               (&local_180,(data_ptr_t *)&local_68,
                                (SortLayout *)local_178._M_head_impl);
            uVar14 = local_b0;
            piVar25 = local_170;
            if (bVar28) {
              uVar26 = uVar26 + 2;
              local_b8 = uVar26 - uVar23;
              make_unsafe_uniq_array_uninitialized<unsigned_char*>((duckdb *)&local_f0,local_b8);
              _Var3._M_head_impl = local_178._M_head_impl;
              local_160 = local_f0._M_head_impl;
              iVar20 = *(idx_t *)((long)local_178._M_head_impl + 0xf8);
              for (lVar18 = 0; lVar18 + uVar23 < uVar26; lVar18 = lVar18 + 1) {
                local_f0._M_head_impl[lVar18] = pdVar19;
                pdVar19 = pdVar19 + iVar20;
              }
              pvVar12 = vector<duckdb::OrderType,_true>::get<true>(local_90,local_180);
              local_e0.free_function._4_4_ =
                   ((*pvVar12 != DESCENDING) - 1) + (uint)(*pvVar12 != DESCENDING);
              pmVar13 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at(local_98,&local_180);
              local_f8 = vector<unsigned_long,_true>::get<true>(local_a0,*pmVar13);
              pvVar10 = vector<duckdb::LogicalType,_true>::get<true>(&local_a8->types,*pmVar13);
              LogicalType::LogicalType(&local_80,pvVar10);
              ppuVar27 = local_160 + (uVar26 - uVar23);
              local_130.allocator.ptr = &local_e0;
              local_130.pointer = (data_ptr_t)((long)&local_e0.free_function + 4);
              local_130.allocated_size = (idx_t)_Var3._M_head_impl;
              pvStack_118 = local_f8;
              local_110 = &local_e8;
              pLStack_108 = &local_80;
              if (local_160 != ppuVar27) {
                lVar24 = (long)ppuVar27 - (long)local_160;
                uVar14 = lVar24 >> 3;
                lVar18 = 0x3f;
                if (uVar14 != 0) {
                  for (; uVar14 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                  }
                }
                __comp._M_comp.order = (int *)local_130.pointer;
                __comp._M_comp.blob_ptr = (data_ptr_t *)local_130.allocator.ptr;
                __comp._M_comp.sort_layout = (SortLayout *)_Var3._M_head_impl;
                __comp._M_comp.tie_col_offset = local_f8;
                __comp._M_comp.row_width = local_110;
                __comp._M_comp.logical_type = &local_80;
                ::std::
                __introsort_loop<unsigned_char**,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                          (local_160,ppuVar27,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,__comp);
                if (lVar24 < 0x81) {
                  __comp_02._M_comp.order = (int *)local_130.pointer;
                  __comp_02._M_comp.blob_ptr = (data_ptr_t *)local_130.allocator.ptr;
                  __comp_02._M_comp.sort_layout = (SortLayout *)local_130.allocated_size;
                  __comp_02._M_comp.tie_col_offset = pvStack_118;
                  __comp_02._M_comp.row_width = local_110;
                  __comp_02._M_comp.logical_type = pLStack_108;
                  ::std::
                  __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                            (local_160,ppuVar27,__comp_02);
                }
                else {
                  ppuVar27 = local_160 + 0x10;
                  __comp_00._M_comp.order = (int *)local_130.pointer;
                  __comp_00._M_comp.blob_ptr = (data_ptr_t *)local_130.allocator.ptr;
                  __comp_00._M_comp.sort_layout = (SortLayout *)local_130.allocated_size;
                  __comp_00._M_comp.tie_col_offset = pvStack_118;
                  __comp_00._M_comp.row_width = local_110;
                  __comp_00._M_comp.logical_type = pLStack_108;
                  ::std::
                  __insertion_sort<unsigned_char**,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                            (local_160,ppuVar27,__comp_00);
                  uVar14 = uVar17;
                  if (local_168 < uVar17) {
                    uVar14 = local_168;
                  }
                  for (lVar18 = uVar14 * 8 + uVar23 * -8 + -0x78; lVar18 != 0; lVar18 = lVar18 + -8)
                  {
                    __comp_01._M_comp.order = (int *)local_130.pointer;
                    __comp_01._M_comp.blob_ptr = (data_ptr_t *)local_130.allocator.ptr;
                    __comp_01._M_comp.sort_layout = (SortLayout *)local_130.allocated_size;
                    __comp_01._M_comp.tie_col_offset = pvStack_118;
                    __comp_01._M_comp.row_width = local_110;
                    __comp_01._M_comp.logical_type = pLStack_108;
                    ::std::
                    __unguarded_linear_insert<unsigned_char**,__gnu_cxx::__ops::_Val_comp_iter<duckdb::SortTiedBlobs(duckdb::BufferManager&,unsigned_char*,unsigned_long_const&,unsigned_long_const&,unsigned_long_const&,bool*,unsigned_char*,duckdb::SortLayout_const&)::__0>>
                              (ppuVar27,__comp_01);
                    ppuVar27 = ppuVar27 + 1;
                  }
                }
              }
              iVar5 = (*local_c0->_vptr_BufferManager[0x14])();
              Allocator::Allocate(&local_130,(Allocator *)CONCAT44(extraout_var,iVar5),
                                  *(idx_t *)((long)_Var3._M_head_impl + 0xf8) * local_b8);
              uVar14 = uVar17;
              if (local_168 < uVar17) {
                uVar14 = local_168;
              }
              pdVar19 = local_130.pointer;
              for (lVar18 = 0; _Var3._M_head_impl = local_178._M_head_impl,
                  (uVar14 - uVar23) + 1 != lVar18; lVar18 = lVar18 + 1) {
                FastMemcpy(pdVar19,local_160[lVar18],*(idx_t *)((long)local_178._M_head_impl + 0xf8)
                          );
                pdVar19 = pdVar19 + *(idx_t *)((long)_Var3._M_head_impl + 0xf8);
              }
              switchD_00916250::default
                        (local_100 + *(idx_t *)((long)local_178._M_head_impl + 0xf8) * uVar23,
                         local_130.pointer,
                         local_b8 * *(idx_t *)((long)local_178._M_head_impl + 0xf8));
              if (local_180 < *(idx_t *)&(_Var3._M_head_impl)->field_0x0 - 1) {
                lVar18 = *(idx_t *)((long)local_178._M_head_impl + 0xf8) * uVar23;
                pdVar19 = local_100 + *(idx_t *)((long)local_178._M_head_impl + 0xf0) + lVar18;
                l_ptr = local_e0.allocate_function +
                        *local_f8 +
                        *(uint *)(local_100 +
                                 *(idx_t *)((long)local_178._M_head_impl + 0xf0) + lVar18) *
                        local_e8;
                if (local_168 < uVar17) {
                  uVar17 = local_168;
                }
                for (; uVar17 != uVar23; uVar23 = uVar23 + 1) {
                  iVar20 = *(idx_t *)((long)local_178._M_head_impl + 0xf8);
                  r_ptr = local_e0.allocate_function +
                          *local_f8 + *(uint *)(pdVar19 + iVar20) * local_e8;
                  iVar5 = Comparators::CompareVal((data_ptr_t)l_ptr,(data_ptr_t)r_ptr,&local_80);
                  pdVar19 = pdVar19 + iVar20;
                  local_150[uVar23] = iVar5 == 0;
                  l_ptr = r_ptr;
                }
              }
              ties._M_head_impl = local_150;
              AllocatedData::~AllocatedData(&local_130);
              LogicalType::~LogicalType(&local_80);
              ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::
              ~unique_ptr((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_> *)
                          &local_f0);
              uVar14 = local_b0;
              piVar25 = local_170;
            }
          }
          uVar23 = uVar14 + 1;
        }
        BufferHandle::~BufferHandle(&local_60);
        bVar28 = AnyTies(ties._M_head_impl,piVar25);
        this = (LocalSortState *)local_e0.private_data;
        if (!bVar28) break;
      }
      local_140 = local_140 + local_158;
      local_158 = 0;
      pSVar21 = *(SortLayout **)((long)this + 0x10);
      bVar28 = false;
    }
  }
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_148);
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void LocalSortState::SortInMemory() {
	auto &sb = *sorted_blocks.back();
	auto &block = *sb.radix_sorting_data.back();
	const auto &count = block.count;
	auto handle = buffer_manager->Pin(block.block);
	const auto dataptr = handle.Ptr();
	// Assign an index to each row
	data_ptr_t idx_dataptr = dataptr + sort_layout->comparison_size;
	for (uint32_t i = 0; i < count; i++) {
		Store<uint32_t>(i, idx_dataptr);
		idx_dataptr += sort_layout->entry_size;
	}
	// Radix sort and break ties until no more ties, or until all columns are sorted
	idx_t sorting_size = 0;
	idx_t col_offset = 0;
	unsafe_unique_array<bool> ties_ptr;
	bool *ties = nullptr;
	bool contains_string = false;
	for (idx_t i = 0; i < sort_layout->column_count; i++) {
		sorting_size += sort_layout->column_sizes[i];
		contains_string = contains_string || sort_layout->logical_types[i].InternalType() == PhysicalType::VARCHAR;
		if (sort_layout->constant_size[i] && i < sort_layout->column_count - 1) {
			// Add columns to the sorting size until we reach a variable size column, or the last column
			continue;
		}

		if (!ties) {
			// This is the first sort
			RadixSort(*buffer_manager, dataptr, count, col_offset, sorting_size, *sort_layout, contains_string);
			ties_ptr = make_unsafe_uniq_array_uninitialized<bool>(count);
			ties = ties_ptr.get();
			std::fill_n(ties, count - 1, true);
			ties[count - 1] = false;
		} else {
			// For subsequent sorts, we only have to subsort the tied tuples
			SubSortTiedTuples(*buffer_manager, dataptr, count, col_offset, sorting_size, ties, *sort_layout,
			                  contains_string);
		}

		contains_string = false;

		if (sort_layout->constant_size[i] && i == sort_layout->column_count - 1) {
			// All columns are sorted, no ties to break because last column is constant size
			break;
		}

		ComputeTies(dataptr, count, col_offset, sorting_size, ties, *sort_layout);
		if (!AnyTies(ties, count)) {
			// No ties, stop sorting
			break;
		}

		if (!sort_layout->constant_size[i]) {
			SortTiedBlobs(*buffer_manager, sb, ties, dataptr, count, i, *sort_layout);
			if (!AnyTies(ties, count)) {
				// No more ties after tie-breaking, stop
				break;
			}
		}

		col_offset += sorting_size;
		sorting_size = 0;
	}
}